

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

double __thiscall IR::IRBuilder::exp(IRBuilder *this,double __x)

{
  BasicBlock *this_00;
  bool bVar1;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar2;
  reference local_20;
  Expr *local_18;
  Expr *expr_local;
  IRBuilder *this_local;
  
  expr_local = (Expr *)this;
  bVar1 = BasicBlock::isTerminated(this->block_);
  dVar2 = extraout_XMM0_Qa;
  if (!bVar1) {
    std::forward_list<IR::Exp,std::allocator<IR::Exp>>::emplace_front<IR::Expr_const*&>
              ((forward_list<IR::Exp,std::allocator<IR::Exp>> *)&this->function_->exps_,&local_18);
    this_00 = this->block_;
    local_20 = std::forward_list<IR::Exp,_std::allocator<IR::Exp>_>::front(&this->function_->exps_);
    std::vector<IR::Stmt_*,_std::allocator<IR::Stmt_*>_>::push_back
              (&this_00->super_vector<IR::Stmt_*,_std::allocator<IR::Stmt_*>_>,
               (value_type *)&local_20);
    dVar2 = extraout_XMM0_Qa_00;
  }
  return dVar2;
}

Assistant:

void IRBuilder::exp(const Expr* expr) {
  if (block_->isTerminated()) return;
  function_->exps_.emplace_front(expr);
  block_->push_back(&function_->exps_.front());
}